

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

bool __thiscall
despot::POMDPX::Step
          (POMDPX *this,State *s,double random_num,ACT_TYPE action,double *reward,OBS_TYPE *obs)

{
  bool bVar1;
  OBS_TYPE OVar2;
  State *state;
  double dVar3;
  double local_38;
  
  state = s + 1;
  local_38 = random_num;
  Parser::GetNextState(this->parser_,(vector<int,_std::allocator<int>_> *)state,action,&local_38);
  dVar3 = Parser::GetReward(this->parser_,action);
  *reward = dVar3;
  OVar2 = Parser::GetObservation
                    (this->parser_,(vector<int,_std::allocator<int>_> *)state,action,&local_38);
  *obs = OVar2;
  bVar1 = Parser::IsTerminalState(this->parser_,(vector<int,_std::allocator<int>_> *)state);
  return bVar1;
}

Assistant:

bool POMDPX::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	POMDPXState& state = static_cast<POMDPXState&>(s);

	parser_->GetNextState(state.vec_id, action, random_num);
	reward = parser_->GetReward(action); // Prev state and curr state set in GetNextState
	obs = parser_->GetObservation(state.vec_id, action, random_num);

	return parser_->IsTerminalState(state.vec_id);
}